

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int extraout_EAX;
  action *paVar1;
  long lVar2;
  UI *ui;
  
  ui = (UI *)(ulong)(uint)argc;
  set_signals();
  getargs(argc,argv);
  open_files();
  reader(ui,(UI_STRING *)argv);
  lr0();
  lalr();
  make_parser();
  verbose();
  output();
  done(0);
  parser = (action **)allocate(nstates << 3);
  for (lVar2 = 0; lVar2 < nstates; lVar2 = lVar2 + 1) {
    paVar1 = parse_actions((int)lVar2);
    parser[lVar2] = paVar1;
  }
  find_final_state();
  remove_conflicts();
  unused_rules();
  if (RRtotal + SRtotal != 0 && SCARRY4(RRtotal,SRtotal) == RRtotal + SRtotal < 0) {
    total_conflicts();
  }
  defreds();
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
    set_signals();
    getargs(argc, argv);
    open_files();
    reader();
    lr0();
    lalr();
    make_parser();
    verbose();
    output();
    done(0);
    return 0;
}